

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O0

int xmlC14NExecute(xmlDocPtr doc,xmlC14NIsVisibleCallback is_visible_callback,void *user_data,
                  int mode,xmlChar **inclusive_ns_prefixes,int with_comments,xmlOutputBufferPtr buf)

{
  int iVar1;
  xmlC14NCtxPtr ctx_00;
  int ret;
  xmlC14NMode c14n_mode;
  xmlC14NCtxPtr ctx;
  int with_comments_local;
  xmlChar **inclusive_ns_prefixes_local;
  int mode_local;
  void *user_data_local;
  xmlC14NIsVisibleCallback is_visible_callback_local;
  xmlDocPtr doc_local;
  
  if ((buf == (xmlOutputBufferPtr)0x0) || (doc == (xmlDocPtr)0x0)) {
    xmlC14NErrParam("executing c14n");
    doc_local._4_4_ = -1;
  }
  else if ((uint)mode < 3) {
    if (buf->encoder == (xmlCharEncodingHandlerPtr)0x0) {
      ctx_00 = xmlC14NNewCtx(doc,is_visible_callback,user_data,mode,inclusive_ns_prefixes,
                             with_comments,buf);
      if (ctx_00 == (xmlC14NCtxPtr)0x0) {
        xmlC14NErr((xmlC14NCtxPtr)0x0,(xmlNodePtr)doc,0x79e,
                   "xmlC14NExecute: unable to create C14N context\n");
        doc_local._4_4_ = -1;
      }
      else if ((doc->children == (_xmlNode *)0x0) ||
              (iVar1 = xmlC14NProcessNodeList(ctx_00,doc->children), -1 < iVar1)) {
        doc_local._4_4_ = xmlOutputBufferFlush(buf);
        if (doc_local._4_4_ < 0) {
          xmlC14NErrInternal("flushing output buffer");
          xmlC14NFreeCtx(ctx_00);
          doc_local._4_4_ = -1;
        }
        else {
          xmlC14NFreeCtx(ctx_00);
        }
      }
      else {
        xmlC14NErrInternal("processing docs children list");
        xmlC14NFreeCtx(ctx_00);
        doc_local._4_4_ = -1;
      }
    }
    else {
      xmlC14NErr((xmlC14NCtxPtr)0x0,(xmlNodePtr)doc,0x79f,
                 "xmlC14NExecute: output buffer encoder != NULL but C14N requires UTF8 output\n");
      doc_local._4_4_ = -1;
    }
  }
  else {
    xmlC14NErrParam("invalid mode for executing c14n");
    doc_local._4_4_ = -1;
  }
  return doc_local._4_4_;
}

Assistant:

int
xmlC14NExecute(xmlDocPtr doc, xmlC14NIsVisibleCallback is_visible_callback,
	 void* user_data, int mode, xmlChar **inclusive_ns_prefixes,
	 int with_comments, xmlOutputBufferPtr buf) {

    xmlC14NCtxPtr ctx;
    xmlC14NMode c14n_mode = XML_C14N_1_0;
    int ret;

    if ((buf == NULL) || (doc == NULL)) {
        xmlC14NErrParam("executing c14n");
        return (-1);
    }

    /* for backward compatibility, we have to have "mode" as "int"
       and here we check that user gives valid value */
    switch(mode) {
    case XML_C14N_1_0:
    case XML_C14N_EXCLUSIVE_1_0:
    case XML_C14N_1_1:
         c14n_mode = (xmlC14NMode)mode;
         break;
    default:
        xmlC14NErrParam("invalid mode for executing c14n");
        return (-1);
    }

    /*
     *  Validate the encoding output buffer encoding
     */
    if (buf->encoder != NULL) {
        xmlC14NErr(NULL, (xmlNodePtr) doc, XML_C14N_REQUIRES_UTF8,
"xmlC14NExecute: output buffer encoder != NULL but C14N requires UTF8 output\n");
        return (-1);
    }

    ctx = xmlC14NNewCtx(doc, is_visible_callback, user_data,
	            c14n_mode, inclusive_ns_prefixes,
                    with_comments, buf);
    if (ctx == NULL) {
        xmlC14NErr(NULL, (xmlNodePtr) doc, XML_C14N_CREATE_CTXT,
		   "xmlC14NExecute: unable to create C14N context\n");
        return (-1);
    }



    /*
     * Root Node
     * The root node is the parent of the top-level document element. The
     * result of processing each of its child nodes that is in the node-set
     * in document order. The root node does not generate a byte order mark,
     * XML declaration, nor anything from within the document type
     * declaration.
     */
    if (doc->children != NULL) {
        ret = xmlC14NProcessNodeList(ctx, doc->children);
        if (ret < 0) {
            xmlC14NErrInternal("processing docs children list");
            xmlC14NFreeCtx(ctx);
            return (-1);
        }
    }

    /*
     * Flush buffer to get number of bytes written
     */
    ret = xmlOutputBufferFlush(buf);
    if (ret < 0) {
        xmlC14NErrInternal("flushing output buffer");
        xmlC14NFreeCtx(ctx);
        return (-1);
    }

    /*
     * Cleanup
     */
    xmlC14NFreeCtx(ctx);
    return (ret);
}